

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.inl
# Opt level: O2

uint32_t __thiscall
bits::detail::
RadixSort<11U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>::
operator()(RadixSort<11U,_unsigned_long,_unsigned_int,_bits::detail::PassThrough,_bits::detail::PassThrough>
           *this,unsigned_long *keys_in,unsigned_long *keys_temp,uint *values_in,uint *values_temp,
          uint32_t size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  uint32_t (*pauVar5) [2048];
  long lVar6;
  uint32_t *puVar7;
  ulong uVar8;
  uint32_t *puVar9;
  long lVar10;
  ulong uVar11;
  uint *values [2];
  unsigned_long *keys [2];
  uint32_t sum [6];
  uint32_t hist [6] [2048];
  
  uVar3 = (ulong)size;
  memset(hist,0,0xc000);
  for (uVar11 = 0; uVar11 != uVar3; uVar11 = uVar11 + 1) {
    uVar8 = keys_in[uVar11];
    pauVar5 = hist;
    for (lVar6 = 0; lVar6 != 0x42; lVar6 = lVar6 + 0xb) {
      (*pauVar5)[(uint)(uVar8 >> ((byte)lVar6 & 0x3f)) & 0x7ff] =
           (*pauVar5)[(uint)(uVar8 >> ((byte)lVar6 & 0x3f)) & 0x7ff] + 1;
      pauVar5 = pauVar5 + 1;
    }
  }
  pauVar5 = hist;
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    uVar1 = (*pauVar5)[0];
    (*pauVar5)[0] = 0;
    sum[lVar6] = uVar1;
    pauVar5 = pauVar5 + 1;
  }
  puVar7 = hist[0];
  for (lVar6 = 1; puVar7 = puVar7 + 1, lVar6 != 0x800; lVar6 = lVar6 + 1) {
    puVar9 = puVar7;
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      uVar1 = sum[lVar10];
      uVar2 = *puVar9;
      *puVar9 = uVar1;
      sum[lVar10] = uVar2 + uVar1;
      puVar9 = puVar9 + 0x800;
    }
  }
  values[0] = values_in;
  values[1] = values_temp;
  keys[0] = keys_in;
  keys[1] = keys_temp;
  RadixSort<11u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (keys_in,keys_temp,values_in,values_temp,uVar3,hist,0);
  lVar10 = 0xb;
  pauVar5 = hist;
  for (lVar6 = 1; pauVar5 = pauVar5 + 1, lVar6 != 5; lVar6 = lVar6 + 1) {
    uVar4 = (uint)lVar6 & 1;
    uVar11 = (ulong)(uVar4 << 3);
    uVar8 = (ulong)((uVar4 ^ 1) << 3);
    RadixSort<11u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
    radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
              (*(undefined8 *)((long)keys + uVar11),*(undefined8 *)((long)keys + uVar8),
               *(undefined8 *)((long)values + uVar11),*(undefined8 *)((long)values + uVar8),uVar3,
               pauVar5,lVar10);
    lVar10 = lVar10 + 0xb;
  }
  RadixSort<11u,unsigned_long,unsigned_int,bits::detail::PassThrough,bits::detail::PassThrough>::
  radix_pass<bits::detail::PassThrough,bits::detail::PassThrough>
            (keys_temp,keys_in,values_temp,values_in,uVar3,hist + 5,0x37);
  return 0;
}

Assistant:

uint32_t operator()(KeyType* __restrict keys_in,
        KeyType* __restrict keys_temp, ValueType* __restrict values_in,
        ValueType* __restrict values_temp, uint32_t size) const
    {
        DecodeOp decode_op;
        EncodeOp encode_op;
        PassThrough pass_through;

        // Initialise each histogram bucket with the key value
        uint32_t hist[kHistBuckets][kHistSize] = {0};
        for (uint32_t i = 0; i < size; ++i)
        {
            const KeyType key = decode_op(keys_in[i]);
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                const uint32_t shift = bucket * kRadixBits;
                const uint32_t pos = (key >> shift) & kHistMask;
                ++hist[bucket][pos];
            }
        }

        // Update the histogram data so each entry sums the previous entries
        uint32_t sum[kHistBuckets];
        for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
        {
            sum[bucket] = hist[bucket][0];
            hist[bucket][0] = 0;
        }

        uint32_t tsum;
        for (uint32_t i = 1; i < kHistSize; ++i)
        {
            for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
            {
                tsum = hist[bucket][i] + sum[bucket];
                hist[bucket][i] = sum[bucket];
                sum[bucket] = tsum;
            }
        }

        // alternate input and output buffers on each radix pass
        KeyType* __restrict keys[2] = {keys_in, keys_temp};
        ValueType* __restrict values[2] = {values_in, values_temp};

        uint32_t out = 0;

        {
            // decode key on first radix pass
            const uint32_t bucket = 0;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, decode_op, pass_through);
        }

        for (uint32_t bucket = 1; bucket < kHistBuckets - 1; ++bucket)
        {
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, pass_through);
        }

        {
            // encode key on last radix pass
            const uint32_t bucket = kHistBuckets - 1;
            const uint32_t in = bucket & 1;
            out = !in;
            radix_pass(keys[in], keys[out], values[in], values[out], size, hist[bucket],
                bucket * kRadixBits, pass_through, encode_op);
        }

        return out;
    }